

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O2

void __thiscall Reducer::loadWorking(Reducer *this)

{
  unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> *this_00;
  Module *pMVar1;
  __uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_> __p_00;
  pointer __p;
  pointer __p_01;
  __uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_> local_1f8 [49];
  string local_70 [32];
  string local_50 [36];
  undefined2 local_2c [2];
  undefined4 local_28;
  ModuleReader reader;
  
  std::make_unique<wasm::Module>();
  __p_00._M_t.super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
  super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl =
       local_1f8[0]._M_t.super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
       super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
  this_00 = &this->module;
  local_1f8[0]._M_t.super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
  super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl =
       (tuple<wasm::Module_*,_std::default_delete<wasm::Module>_>)
       (_Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>)0x0;
  std::__uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>::reset
            ((__uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_> *)this_00,
             (pointer)__p_00._M_t.
                      super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
                      super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl);
  std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::~unique_ptr
            ((unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> *)local_1f8);
  local_28 = 0;
  reader.super_ModuleIOBase.debugInfo = false;
  local_2c[0] = 1;
  std::__cxx11::string::string(local_70,(string *)&this->working);
  pMVar1 = (this_00->_M_t).super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>.
           _M_t.super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
           super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>(local_50,"",(allocator<char> *)local_1f8);
  wasm::ModuleReader::read(local_2c,local_70,pMVar1,local_50);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  pMVar1 = (this_00->_M_t).super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>.
           _M_t.super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
           super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
  if (pMVar1->hasFeaturesSection == false) {
    (pMVar1->features).features = 0x1efff;
  }
  wasm::ToolOptions::applyFeatures(this->toolOptions,pMVar1);
  pMVar1 = (this->module)._M_t.
           super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
           super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
  __p_01 = (pointer)operator_new(8);
  __p_01->wasm = pMVar1;
  local_1f8[0]._M_t.super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
  super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl =
       (tuple<wasm::Module_*,_std::default_delete<wasm::Module>_>)
       (_Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>)0x0;
  std::__uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>::reset
            ((__uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_> *)&this->builder,
             __p_01);
  std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::~unique_ptr
            ((unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_> *)local_1f8);
  (this->
  super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>).
  super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
  super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.currModule =
       (this->module)._M_t.super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>.
       _M_t.super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
       super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
  return;
}

Assistant:

void loadWorking() {
    module = std::make_unique<Module>();
    ModuleReader reader;
    try {
      reader.read(working, *module);
    } catch (ParseException& p) {
      p.dump(std::cerr);
      std::cerr << '\n';
      Fatal() << "error in parsing working wasm binary";
    }

    // If there is no features section, assume we may need them all (without
    // this, a module with no features section but that uses e.g. atomics and
    // bulk memory would not work).
    if (!module->hasFeaturesSection) {
      module->features = FeatureSet::All;
    }
    // Apply features the user passed on the commandline.
    toolOptions.applyFeatures(*module);

    builder = std::make_unique<Builder>(*module);
    setModule(module.get());
  }